

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NvmlLib.cpp
# Opt level: O2

NvmlHealth * xmrig::NvmlLib::health(NvmlHealth *__return_storage_ptr__,nvmlDevice_t device)

{
  uint32_t *puVar1;
  uint uVar2;
  uint in_EAX;
  int iVar3;
  ulong extraout_RDX;
  ulong uVar4;
  uint32_t i;
  int iVar5;
  uint uStack_28;
  uint32_t speed;
  
  if (device == (nvmlDevice_t)0x0) {
    (__return_storage_ptr__->fanSpeed).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->clock = 0;
    __return_storage_ptr__->memClock = 0;
    (__return_storage_ptr__->fanSpeed).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (__return_storage_ptr__->fanSpeed).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    __return_storage_ptr__->power = 0;
    __return_storage_ptr__->temperature = 0;
  }
  else {
    (__return_storage_ptr__->fanSpeed).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->clock = 0;
    __return_storage_ptr__->memClock = 0;
    (__return_storage_ptr__->fanSpeed).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (__return_storage_ptr__->fanSpeed).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    __return_storage_ptr__->power = 0;
    __return_storage_ptr__->temperature = 0;
    uStack_28 = in_EAX;
    (*pNvmlDeviceGetTemperature)(device,0,&__return_storage_ptr__->temperature);
    puVar1 = &__return_storage_ptr__->power;
    (*pNvmlDeviceGetPowerUsage)(device,puVar1);
    (*pNvmlDeviceGetClockInfo)(device,1,&__return_storage_ptr__->clock);
    (*pNvmlDeviceGetClockInfo)(device,2,&__return_storage_ptr__->memClock);
    uVar2 = *puVar1;
    uVar4 = extraout_RDX;
    if (uVar2 != 0) {
      uVar4 = (ulong)uVar2 % 1000;
      *puVar1 = uVar2 / 1000;
    }
    _uStack_28 = (ulong)uStack_28;
    if (pNvmlDeviceGetFanSpeed_v2 == (code *)0x0) {
      (*pNvmlDeviceGetFanSpeed)(device,&speed,uVar4);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&__return_storage_ptr__->fanSpeed,&speed);
    }
    else {
      iVar5 = 0;
      while( true ) {
        iVar3 = (*pNvmlDeviceGetFanSpeed_v2)(device,iVar5,&speed);
        if (iVar3 != 0) break;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&__return_storage_ptr__->fanSpeed,&speed);
        iVar5 = iVar5 + 1;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

NvmlHealth xmrig::NvmlLib::health(nvmlDevice_t device)
{
    if (!device) {
        return {};
    }

    NvmlHealth health;
    pNvmlDeviceGetTemperature(device, NVML_TEMPERATURE_GPU, &health.temperature);
    pNvmlDeviceGetPowerUsage(device, &health.power);
    pNvmlDeviceGetClockInfo(device, NVML_CLOCK_SM, &health.clock);
    pNvmlDeviceGetClockInfo(device, NVML_CLOCK_MEM, &health.memClock);

    if (health.power) {
        health.power /= 1000;
    }

    uint32_t speed = 0;

    if (pNvmlDeviceGetFanSpeed_v2) {
        uint32_t i = 0;

        while (pNvmlDeviceGetFanSpeed_v2(device, i, &speed) == NVML_SUCCESS) {
            health.fanSpeed.push_back(speed);
            ++i;
        }

    }
    else {
        pNvmlDeviceGetFanSpeed(device, &speed);

        health.fanSpeed.push_back(speed);
    }

    return health;
}